

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockParameterTest_outputAndIntParametersOfSameNameInDifferentFunctionCallsOfSameFunctionSucceeds_TestShell
::createTest(TEST_MockParameterTest_outputAndIntParametersOfSameNameInDifferentFunctionCallsOfSameFunctionSucceeds_TestShell
             *this)

{
  Utest *this_00;
  TEST_MockParameterTest_outputAndIntParametersOfSameNameInDifferentFunctionCallsOfSameFunctionSucceeds_TestShell
  *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
                                  ,0x2ff);
  TEST_MockParameterTest_outputAndIntParametersOfSameNameInDifferentFunctionCallsOfSameFunctionSucceeds_Test
  ::
  TEST_MockParameterTest_outputAndIntParametersOfSameNameInDifferentFunctionCallsOfSameFunctionSucceeds_Test
            ((TEST_MockParameterTest_outputAndIntParametersOfSameNameInDifferentFunctionCallsOfSameFunctionSucceeds_Test
              *)this_00);
  return this_00;
}

Assistant:

TEST(MockParameterTest, outputAndIntParametersOfSameNameInDifferentFunctionCallsOfSameFunctionSucceeds)
{
    int param = 1;
    int retval = 2;

    mock().expectOneCall("foo").withOutputParameterReturning("bar", &retval, sizeof(retval));
    mock().expectOneCall("foo").withIntParameter("bar", 25);
    mock().actualCall("foo").withOutputParameter("bar", &param);
    mock().actualCall("foo").withIntParameter("bar", 25);

    CHECK_EQUAL(2, retval);
    CHECK_EQUAL(2, param);
    mock().checkExpectations();
}